

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

int uv_cancel(uv_req_t *req)

{
  long *plVar1;
  long lVar2;
  uv_loop_t *puVar3;
  uv__queue *puVar4;
  uint uVar5;
  uv_mutex_t *mutex;
  int iVar6;
  uv__queue *puVar7;
  
  uVar5 = req->type - UV_FS;
  if (uVar5 < 5) {
    lVar2 = *(long *)(&DAT_00128b90 + (ulong)uVar5 * 8);
    plVar1 = (long *)((long)req->reserved + lVar2 + -0x18);
    puVar3 = req->loop;
    uv_once(&once,init_once);
    mutex = &::mutex;
    uv_mutex_lock(&::mutex);
    puVar7 = (uv__queue *)((long)req->reserved + lVar2);
    uv_mutex_lock((uv_mutex_t *)(*(long *)((long)req->reserved + lVar2 + -8) + 0xa8));
    puVar4 = puVar7->next;
    if ((puVar4 == puVar7) || (*plVar1 == 0)) {
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0xa8));
      iVar6 = -0x10;
    }
    else {
      *(uv__queue **)plVar1[4] = puVar4;
      puVar4->prev = (uv__queue *)plVar1[4];
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0xa8));
      uv_mutex_unlock(&::mutex);
      *plVar1 = (long)uv__cancelled;
      mutex = &puVar3->wq_mutex;
      uv_mutex_lock(mutex);
      plVar1[3] = (long)&puVar3->wq;
      puVar4 = (puVar3->wq).prev;
      plVar1[4] = (long)puVar4;
      puVar4->next = puVar7;
      (puVar3->wq).prev = puVar7;
      uv_async_send(&puVar3->wq_async);
      iVar6 = 0;
    }
    uv_mutex_unlock(mutex);
  }
  else {
    iVar6 = -0x16;
  }
  return iVar6;
}

Assistant:

int uv_cancel(uv_req_t* req) {
  struct uv__work* wreq;
  uv_loop_t* loop;

  switch (req->type) {
  case UV_FS:
    loop =  ((uv_fs_t*) req)->loop;
    wreq = &((uv_fs_t*) req)->work_req;
    break;
  case UV_GETADDRINFO:
    loop =  ((uv_getaddrinfo_t*) req)->loop;
    wreq = &((uv_getaddrinfo_t*) req)->work_req;
    break;
  case UV_GETNAMEINFO:
    loop = ((uv_getnameinfo_t*) req)->loop;
    wreq = &((uv_getnameinfo_t*) req)->work_req;
    break;
  case UV_RANDOM:
    loop = ((uv_random_t*) req)->loop;
    wreq = &((uv_random_t*) req)->work_req;
    break;
  case UV_WORK:
    loop =  ((uv_work_t*) req)->loop;
    wreq = &((uv_work_t*) req)->work_req;
    break;
  default:
    return UV_EINVAL;
  }

  return uv__work_cancel(loop, req, wreq);
}